

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_boundary_face(REF_GRID ref_grid)

{
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  REF_BOOL has_face;
  REF_INT nodes [4];
  
  pRVar1 = ref_grid->cell[3];
  if (pRVar1->max < 1) {
    bVar3 = 0;
  }
  else {
    uVar8 = 0;
    bVar3 = 0;
    do {
      pRVar2 = pRVar1->c2n;
      iVar5 = pRVar1->size_per * uVar8;
      if (pRVar2[iVar5] != -1) {
        lVar6 = 0;
        do {
          nodes[lVar6] = pRVar2[iVar5 + (int)lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        nodes[3] = nodes[0];
        uVar4 = ref_grid_cell_has_face(ref_grid,nodes,&has_face);
        if (uVar4 != 0) {
          uVar11 = (ulong)uVar4;
          pcVar9 = "has_face";
          uVar7 = 0xb8;
          goto LAB_00208ad2;
        }
        if (has_face == 0) {
          printf("triangle %d nodes %d %d %d global %ld %ld %ld\n",(ulong)uVar8);
          uVar4 = ref_node_location(ref_grid->node,nodes[0]);
          if (uVar4 != 0) {
            uVar11 = (ulong)uVar4;
            pcVar9 = "n0";
            uVar7 = 0xc1;
            goto LAB_00208ad2;
          }
          uVar4 = ref_node_location(ref_grid->node,nodes[1]);
          if (uVar4 != 0) {
            uVar11 = (ulong)uVar4;
            pcVar9 = "n1";
            uVar7 = 0xc2;
            goto LAB_00208ad2;
          }
          uVar4 = ref_node_location(ref_grid->node,nodes[2]);
          bVar3 = 1;
          if (uVar4 != 0) {
            uVar11 = (ulong)uVar4;
            pcVar9 = "n2";
            uVar7 = 0xc3;
            goto LAB_00208ad2;
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < pRVar1->max);
  }
  pRVar1 = ref_grid->cell[6];
  iVar5 = pRVar1->max;
  if (0 < iVar5) {
    iVar10 = 0;
    do {
      pRVar2 = pRVar1->c2n;
      if (pRVar2[(long)pRVar1->size_per * (long)iVar10] != -1) {
        lVar6 = 0;
        do {
          nodes[lVar6] = pRVar2[(long)pRVar1->size_per * (long)iVar10 + lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        uVar8 = ref_grid_cell_has_face(ref_grid,nodes,&has_face);
        if (uVar8 != 0) {
          uVar11 = (ulong)uVar8;
          pcVar9 = "has_face";
          uVar7 = 0xcb;
LAB_00208ad2:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,uVar7,"ref_validation_boundary_face",uVar11,pcVar9);
          return (REF_STATUS)uVar11;
        }
        if (has_face == 0) {
          bVar3 = 1;
        }
        iVar5 = pRVar1->max;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar5);
  }
  return (uint)bVar3;
}

Assistant:

REF_FCN REF_STATUS ref_validation_boundary_face(REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_BOOL has_face;
  REF_INT cell;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL problem;

  problem = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++)
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    nodes[3] = nodes[0];
    RSS(ref_grid_cell_has_face(ref_grid, nodes, &has_face), "has_face");
    if (!has_face) {
      problem = REF_TRUE;
      printf("triangle %d nodes %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT "\n",
             cell, nodes[0], nodes[1], nodes[2],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++)
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    RSS(ref_grid_cell_has_face(ref_grid, nodes, &has_face), "has_face");
    if (!has_face) problem = REF_TRUE;
  }

  return (problem ? REF_FAILURE : REF_SUCCESS);
}